

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O3

comp_quest_t *
mk_comp_quest(float64 *wt_ent_dec,float32 ****mixw,float32 ****means,float32 ****vars,uint32 *veclen
             ,uint32 n_model,uint32 n_state,uint32 n_stream,uint32 n_density,float32 *stwt,
             uint32 *id,uint32 n_id,quest_t *all_q,uint32 n_all_q,pset_t *pset,uint32 n_base_phone,
             uint32 **dfeat,uint32 n_dfeat,uint32 split_min,uint32 split_max,float32 split_thr,
             float32 mwfloor)

{
  dtree_t *tr;
  comp_quest_t *q;
  uint32 disj_len;
  uint32 n_b;
  uint32 n_a;
  
  tr = mk_tree(mixw,means,vars,veclen,n_model,n_state,n_stream,n_density,stwt,id,n_id,all_q,n_all_q,
               pset,dfeat,n_dfeat,split_min,split_max,split_thr,mwfloor);
  if (tr == (dtree_t *)0x0) {
    *wt_ent_dec = 0.0;
    q = (comp_quest_t *)0x0;
  }
  else {
    print_tree(_stderr,"s>",tr->node,pset,1);
    cluster_leaves(tr,veclen,wt_ent_dec,&n_a,&n_b,pset,n_state,n_stream,n_density,stwt,mwfloor);
    disj_len = n_b;
    if (n_a < n_b) {
      disj_len = n_a;
    }
    q = tree2quest(tr,(pset_t *)veclen,split_max,(uint)(n_a < n_b),disj_len);
    free_tree(tr);
    simplify_comp_quest(q,n_base_phone);
  }
  return q;
}

Assistant:

comp_quest_t *
mk_comp_quest(float64 *wt_ent_dec,
	      float32 ****mixw,
              float32 ****means,
              float32 ****vars,
              uint32  *veclen,
	      uint32 n_model,
	      uint32 n_state,
	      uint32 n_stream,
	      uint32 n_density,
	      float32 *stwt,
	
	      uint32 *id,
	      uint32 n_id,

	      quest_t *all_q,
	      uint32 n_all_q,
	      pset_t *pset,
	      uint32 n_base_phone,

	      uint32 **dfeat,
	      uint32 n_dfeat,
	      
	      uint32 split_min,
	      uint32 split_max,
	      float32 split_thr,

	      float32 mwfloor)
{
    dtree_t *tr;
    uint32 n_a, n_b;
    comp_quest_t *q;

    tr = mk_tree(mixw, means, vars, veclen, 
                 n_model, n_state, n_stream, n_density, stwt,
		 id, n_id,
		 all_q, n_all_q, pset,
		 dfeat, n_dfeat,
		 split_min, split_max, split_thr,
		 mwfloor);

    if (tr == NULL) {
	*wt_ent_dec = 0;
	return NULL;
    }

    print_tree(stderr, "s>", &tr->node[0], pset, 1);

    /* Note that the tree now contains both mixw and mean and var info
       so they no longer need to be passed */
    cluster_leaves(tr, veclen, wt_ent_dec, &n_a, &n_b,
		   pset,
		   n_state, n_stream, n_density, stwt,
		   mwfloor);

    /* Build the disjunction w/ the fewest terms */
    if (n_b > n_a) {
	q = tree2quest(tr, pset, split_max, 1, n_a);
    }
    else {
	q = tree2quest(tr, pset, split_max, 0, n_b);
    }

    free_tree(tr);

    if (simplify_comp_quest(q, n_base_phone)) {
    }

    return q;
}